

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolve_common_intrin.h
# Opt level: O0

__m128i convolve_12tap(__m128i *s,__m128i *coeffs)

{
  longlong in_RDX;
  undefined1 (*in_RSI) [16];
  undefined1 (*in_RDI) [16];
  __m128i alVar1;
  __m128i d;
  __m128i d_0123;
  __m128i d5;
  __m128i d4;
  __m128i d3;
  __m128i d2;
  __m128i d1;
  __m128i d0;
  
  pmaddwd(*in_RDI,*in_RSI);
  pmaddwd(in_RDI[1],in_RSI[1]);
  pmaddwd(in_RDI[2],in_RSI[2]);
  pmaddwd(in_RDI[3],in_RSI[3]);
  pmaddwd(in_RDI[4],in_RSI[4]);
  pmaddwd(in_RDI[5],in_RSI[5]);
  alVar1[1] = in_RDX;
  alVar1[0] = (longlong)in_RSI;
  return alVar1;
}

Assistant:

static inline __m128i convolve_12tap(const __m128i *s, const __m128i *coeffs) {
  const __m128i d0 = _mm_madd_epi16(s[0], coeffs[0]);
  const __m128i d1 = _mm_madd_epi16(s[1], coeffs[1]);
  const __m128i d2 = _mm_madd_epi16(s[2], coeffs[2]);
  const __m128i d3 = _mm_madd_epi16(s[3], coeffs[3]);
  const __m128i d4 = _mm_madd_epi16(s[4], coeffs[4]);
  const __m128i d5 = _mm_madd_epi16(s[5], coeffs[5]);
  const __m128i d_0123 =
      _mm_add_epi32(_mm_add_epi32(d0, d1), _mm_add_epi32(d2, d3));
  const __m128i d = _mm_add_epi32(_mm_add_epi32(d4, d5), d_0123);
  return d;
}